

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

void __thiscall
LinkedObjectFile::append_word_to_string(LinkedObjectFile *this,string *dest,LinkedWord *word)

{
  ushort uVar1;
  const_reference pvVar2;
  runtime_error *this_00;
  pointer pcVar3;
  char *pcVar4;
  char buff [128];
  
  switch(word->kind) {
  case PLAIN_DATA:
    sprintf(buff,"    .word 0x%x\n",(ulong)word->data);
    goto LAB_0013a4b9;
  case PTR:
    pvVar2 = std::vector<Label,_std::allocator<Label>_>::at(&this->labels,(long)word->label_id);
    pcVar3 = (pvVar2->name)._M_dataplus._M_p;
    pcVar4 = "    .word %s\n";
    break;
  case HI_PTR:
    uVar1 = *(ushort *)((long)&word->data + 2);
    pvVar2 = std::vector<Label,_std::allocator<Label>_>::at(&this->labels,(long)word->label_id);
    pcVar3 = (pvVar2->name)._M_dataplus._M_p;
    pcVar4 = "    .ptr-hi 0x%x %s\n";
    goto LAB_0013a4b2;
  case LO_PTR:
    uVar1 = *(ushort *)((long)&word->data + 2);
    pvVar2 = std::vector<Label,_std::allocator<Label>_>::at(&this->labels,(long)word->label_id);
    pcVar3 = (pvVar2->name)._M_dataplus._M_p;
    pcVar4 = "    .ptr-lo 0x%x %s\n";
    goto LAB_0013a4b2;
  case SYM_PTR:
    pcVar3 = (word->symbol_name)._M_dataplus._M_p;
    pcVar4 = "    .symbol %s\n";
    break;
  case EMPTY_PTR:
    builtin_strncpy(buff,"    .empty-list\n",0x11);
    goto LAB_0013a4b9;
  case SYM_OFFSET:
    uVar1 = *(ushort *)((long)&word->data + 2);
    pcVar3 = (word->symbol_name)._M_dataplus._M_p;
    pcVar4 = "    .sym-off 0x%x %s\n";
LAB_0013a4b2:
    sprintf(buff,pcVar4,(ulong)uVar1,pcVar3);
    goto LAB_0013a4b9;
  case TYPE_PTR:
    pcVar3 = (word->symbol_name)._M_dataplus._M_p;
    pcVar4 = "    .type %s\n";
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"nyi");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sprintf(buff,pcVar4,pcVar3);
LAB_0013a4b9:
  std::__cxx11::string::append((char *)dest);
  return;
}

Assistant:

void LinkedObjectFile::append_word_to_string(std::string& dest, const LinkedWord& word) const {
  char buff[128];

  switch (word.kind) {
    case LinkedWord::PLAIN_DATA:
      sprintf(buff, "    .word 0x%x\n", word.data);
      break;
    case LinkedWord::PTR:
      sprintf(buff, "    .word %s\n", labels.at(word.label_id).name.c_str());
      break;
    case LinkedWord::SYM_PTR:
      sprintf(buff, "    .symbol %s\n", word.symbol_name.c_str());
      break;
    case LinkedWord::TYPE_PTR:
      sprintf(buff, "    .type %s\n", word.symbol_name.c_str());
      break;
    case LinkedWord::EMPTY_PTR:
      sprintf(buff, "    .empty-list\n");  // ?
      break;
    case LinkedWord::HI_PTR:
      sprintf(buff, "    .ptr-hi 0x%x %s\n", word.data >> 16,
              labels.at(word.label_id).name.c_str());
      break;
    case LinkedWord::LO_PTR:
      sprintf(buff, "    .ptr-lo 0x%x %s\n", word.data >> 16,
              labels.at(word.label_id).name.c_str());
      break;
    case LinkedWord::SYM_OFFSET:
      sprintf(buff, "    .sym-off 0x%x %s\n", word.data >> 16, word.symbol_name.c_str());
      break;
    default:
      throw std::runtime_error("nyi");
  }

  dest += buff;
}